

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O0

void __thiscall slang::SVInt::initSlowCase(SVInt *this,uint64_t value)

{
  uint32_t uVar1;
  ulong __n;
  uint64_t *__s;
  uint local_20;
  uint32_t i;
  uint32_t words;
  uint64_t value_local;
  SVInt *this_local;
  
  uVar1 = getNumWords(this);
  __n = SUB168(ZEXT416(uVar1) * ZEXT816(8),0);
  if (SUB168(ZEXT416(uVar1) * ZEXT816(8),8) != 0) {
    __n = 0xffffffffffffffff;
  }
  __s = (uint64_t *)operator_new__(__n);
  memset(__s,0,__n);
  (this->super_SVIntStorage).field_0.pVal = __s;
  *(this->super_SVIntStorage).field_0.pVal = value;
  if ((((this->super_SVIntStorage).signFlag & 1U) != 0) && ((long)value < 0)) {
    for (local_20 = 1; local_20 < uVar1; local_20 = local_20 + 1) {
      (this->super_SVIntStorage).field_0.pVal[local_20] = 0xffffffffffffffff;
    }
  }
  return;
}

Assistant:

void SVInt::initSlowCase(uint64_t value) {
    uint32_t words = getNumWords();
    pVal = new uint64_t[words](); // allocation is zero cleared
    pVal[0] = value;

    // sign extend if necessary
    if (signFlag && int64_t(value) < 0) {
        for (uint32_t i = 1; i < words; i++)
            pVal[i] = (uint64_t)(-1);
    }
}